

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O3

int Ver_ParseCheckNondrivenNets(Vec_Ptr_t *vUndefs)

{
  void *pvVar1;
  long lVar2;
  Abc_Obj_t *pObj;
  bool bVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  
  iVar4 = vUndefs->nSize;
  if (0 < iVar4) {
    lVar9 = 0;
    do {
      pvVar1 = vUndefs->pArray[lVar9];
      lVar7 = *(long *)((long)pvVar1 + 0x158);
      if (0 < *(int *)(lVar7 + 4)) {
        lVar8 = 0;
        do {
          lVar2 = *(long *)(*(long *)(lVar7 + 8) + lVar8 * 8);
          lVar11 = (long)*(int *)(*(long *)(lVar2 + 0x40) + 4);
          if (0 < lVar11) {
            do {
              lVar7 = *(long *)(lVar2 + 0x40);
              if (*(int *)(lVar7 + 4) < lVar11) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              lVar7 = *(long *)(*(long *)(lVar7 + 8) + (lVar11 + -1) * 8);
              if ((lVar7 != 0) && (lVar5 = *(long *)(lVar7 + 8), 0 < *(int *)(lVar5 + 4))) {
                lVar10 = 0;
                do {
                  pObj = *(Abc_Obj_t **)(*(long *)(lVar5 + 8) + lVar10 * 8);
                  if ((pObj->vFanins).nSize == 0) {
                    pcVar6 = Abc_ObjName(pObj);
                    iVar4 = strcmp(pcVar6,"1\'b0");
                    if (iVar4 != 0) {
                      pcVar6 = Abc_ObjName(pObj);
                      iVar4 = strcmp(pcVar6,"1\'b1");
                      if (iVar4 != 0) {
                        return 1;
                      }
                    }
                  }
                  lVar10 = lVar10 + 1;
                  lVar5 = *(long *)(lVar7 + 8);
                } while (lVar10 < *(int *)(lVar5 + 4));
              }
              bVar3 = 1 < lVar11;
              lVar11 = lVar11 + -1;
            } while (bVar3);
            lVar7 = *(long *)((long)pvVar1 + 0x158);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < *(int *)(lVar7 + 4));
        iVar4 = vUndefs->nSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar4);
  }
  return 0;
}

Assistant:

int Ver_ParseCheckNondrivenNets( Vec_Ptr_t * vUndefs )
{
    Abc_Ntk_t * pNtk;
    Ver_Bundle_t * pBundle;
    Abc_Obj_t * pBox, * pNet;
    int i, k, j, m;
    // go through undef box types
    Vec_PtrForEachEntry( Abc_Ntk_t *, vUndefs, pNtk, i )
        // go through instances of this type
        Vec_PtrForEachEntry( Abc_Obj_t *, (Vec_Ptr_t *)pNtk->pData, pBox, k )
            // go through the bundles of this instance
            Vec_PtrForEachEntryReverse( Ver_Bundle_t *, (Vec_Ptr_t *)pBox->pCopy, pBundle, j )
                // go through the actual nets of this bundle
                if ( pBundle )
                Vec_PtrForEachEntry( Abc_Obj_t *, pBundle->vNetsActual, pNet, m )
                {
                    if ( Abc_ObjFaninNum(pNet) == 0 ) // non-driven
                        if ( strcmp(Abc_ObjName(pNet), "1\'b0") && strcmp(Abc_ObjName(pNet), "1\'b1") ) // diff from a const
                            return 1;
                }
    return 0;
}